

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

long jsteemann::atoi_unchecked<long>(char *p,char *e)

{
  char *e_local;
  char *p_local;
  
  if (p == e) {
    p_local = (char *)0x0;
  }
  else if (*p == '-') {
    p_local = (char *)atoi_negative_unchecked<long>(p + 1,e);
  }
  else {
    e_local = p;
    if (*p == '+') {
      e_local = p + 1;
    }
    p_local = (char *)atoi_positive_unchecked<long>(e_local,e);
  }
  return (long)p_local;
}

Assistant:

inline T atoi_unchecked(char const* p, char const* e) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    return T();
  }

  if (*p == '-') {
    if (!std::is_signed<T>::value) {
      return T();
    }
    return atoi_negative_unchecked<T>(++p, e);
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive_unchecked<T>(p, e);
}